

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::printOriginalList(Graph *this)

{
  int *piVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long lVar3;
  const_iterator __begin2;
  int *piVar4;
  undefined8 uStack_38;
  
  if (this->adjoint_status == true) {
    uStack_38 = in_RAX;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Original Graph: ",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    lVar3 = 0x2bc8;
    do {
      piVar4 = *(int **)((long)(this->adj_matrix + -1) + 0xc4 + lVar3);
      piVar1 = *(int **)((long)this->adj_matrix[0] + lVar3 + 4);
      if (piVar4 != piVar1) {
        do {
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
          uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,(char *)((long)&uStack_38 + 7),1);
          piVar4 = piVar4 + 1;
        } while (piVar4 != piVar1);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
        std::ostream::put(-0x30);
        std::ostream::flush();
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x3078);
  }
  return;
}

Assistant:

void Graph::printOriginalList(){
   if(not(this->adjoint_status)) return void();
   cout << "Original Graph: "<<endl;
   for(const auto &i : this->original_list){
      if(i.empty()) continue;
      for(const int &j: i)
         cout<< j << ' ';
      cout << endl;
   }
}